

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::CreateTar
               (char *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,cmTarCompression compressType,bool verbose,string *mtime,string *format)

{
  bool bVar1;
  string *format_00;
  Compress c;
  pointer pbVar2;
  allocator local_391;
  string path;
  string cwd;
  cmArchiveWrite a;
  string local_270;
  string local_250;
  ofstream fout;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&cwd,(SystemTools *)0x1,SUB41(compressType,0));
  std::ofstream::ofstream(&fout,outFileName,_S_out|_S_bin);
  if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
      == 0) {
    c = CompressNone;
    if (compressType < TarCompressNone) {
      c = *(Compress *)(&DAT_001cb040 + (ulong)compressType * 4);
    }
    if (format->_M_string_length == 0) {
      std::__cxx11::string::string((string *)&path,"paxr",&local_391);
    }
    else {
      std::__cxx11::string::string((string *)&path,(string *)format);
    }
    format_00 = &path;
    cmArchiveWrite::cmArchiveWrite
              (&a,&fout.super_basic_ostream<char,_std::char_traits<char>_>,c,format_00);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::_M_assign((string *)&a.MTime);
    pbVar2 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    a.Verbose = verbose;
    do {
      if (pbVar2 == (files->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) break;
      std::__cxx11::string::string((string *)&path,(string *)pbVar2);
      bVar1 = cmsys::SystemTools::FileIsFullPath(path._M_dataplus._M_p);
      if (bVar1) {
        RelativePath_abi_cxx11_
                  (&local_250,(cmSystemTools *)cwd._M_dataplus._M_p,path._M_dataplus._M_p,
                   (char *)format_00);
        std::__cxx11::string::operator=((string *)&path,(string *)&local_250);
        std::__cxx11::string::~string((string *)&local_250);
      }
      std::__cxx11::string::string((string *)&local_270,(string *)&path);
      format_00 = (string *)0x0;
      bVar1 = cmArchiveWrite::Add(&a,&local_270,0,(char *)0x0,true);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&path);
      pbVar2 = pbVar2 + 1;
    } while (bVar1);
    bVar1 = a.Error._M_string_length == 0;
    if (!bVar1) {
      std::__cxx11::string::string((string *)&path,(string *)&a.Error);
      Error(path._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)&path);
    }
    cmArchiveWrite::~cmArchiveWrite(&a);
  }
  else {
    std::__cxx11::string::string((string *)&a,"Cannot open output file \"",(allocator *)&path);
    std::__cxx11::string::append((char *)&a);
    std::__cxx11::string::append((char *)&a);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::append((string *)&a);
    std::__cxx11::string::~string((string *)&path);
    Error((char *)a.Stream,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)&a);
    bVar1 = false;
  }
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&cwd);
  return bVar1;
}

Assistant:

bool cmSystemTools::CreateTar(const char* outFileName,
                              const std::vector<std::string>& files,
                              cmTarCompression compressType,
                              bool verbose, std::string const& mtime,
                              std::string const& format)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmsys::ofstream fout(outFileName, std::ios::out | std::ios::binary);
  if(!fout)
    {
    std::string e = "Cannot open output file \"";
    e += outFileName;
    e += "\": ";
    e += cmSystemTools::GetLastSystemError();
    cmSystemTools::Error(e.c_str());
    return false;
    }
  cmArchiveWrite::Compress compress = cmArchiveWrite::CompressNone;
  switch (compressType)
    {
    case TarCompressGZip:
      compress = cmArchiveWrite::CompressGZip;
      break;
    case TarCompressBZip2:
      compress = cmArchiveWrite::CompressBZip2;
      break;
    case TarCompressXZ:
      compress = cmArchiveWrite::CompressXZ;
      break;
    case TarCompressNone:
      compress = cmArchiveWrite::CompressNone;
      break;
    }

  cmArchiveWrite a(fout, compress,
    format.empty() ? "paxr" : format);

  a.SetMTime(mtime);
  a.SetVerbose(verbose);
  for(std::vector<std::string>::const_iterator i = files.begin();
      i != files.end(); ++i)
    {
    std::string path = *i;
    if(cmSystemTools::FileIsFullPath(path.c_str()))
      {
      // Get the relative path to the file.
      path = cmSystemTools::RelativePath(cwd.c_str(), path.c_str());
      }
    if(!a.Add(path))
      {
      break;
      }
    }
  if(!a)
    {
    cmSystemTools::Error(a.GetError().c_str());
    return false;
    }
  return true;
#else
  (void)outFileName;
  (void)files;
  (void)verbose;
  return false;
#endif
}